

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

void AssignRegisters(ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator)

{
  OpCode OVar1;
  ushort uVar2;
  code *pcVar3;
  bool bVar4;
  RegSlot RVar5;
  uint uVar6;
  LocalFunctionId LVar7;
  FuncInfo *pFVar8;
  ParseNodeCase *pPVar9;
  ParseNodeFor *pPVar10;
  ParseNodeBlock *pPVar11;
  FuncInfo *pFVar12;
  ParseNodeForInOrForOf *pPVar13;
  ParseNodeVar *pPVar14;
  ParseNodeVar *pPVar15;
  Symbol *pSVar16;
  ParseNodeStrTemplate *pPVar17;
  undefined4 *puVar18;
  ParseNodeParamPattern *pPVar19;
  ParseNodeTri *pPVar20;
  FunctionBody *pFVar21;
  ParseNodeInt *pPVar22;
  ParseNodeExportDefault *pPVar23;
  ParseNodeStr *pPVar24;
  ParseNodeFloat *pPVar25;
  ParseNodeName *pPVar26;
  ParseNodeFnc *pPVar27;
  ParseNodeBin *pPVar28;
  ParseNodeCall *pPVar29;
  ParseNodeFor *pPVar30;
  uint uVar31;
  char16_t *reason;
  ParseNodePtr pnode_00;
  undefined1 local_40 [8];
  CharacterBuffer<char16_t> symName;
  
  if (pnode == (ParseNode *)0x0) {
    return;
  }
  switch(pnode->nop) {
  case knopName:
    pPVar26 = ParseNode::AsParseNodeName(pnode);
    pSVar16 = pPVar26->sym;
    if (pSVar16 == (Symbol *)0x0) {
      pPVar26 = ParseNode::AsParseNodeName(pnode);
      if (pPVar26->pid->m_propertyId == -1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar18 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar18 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0x13fd,
                           "(pnode->AsParseNodeName()->pid->GetPropertyId() != Js::Constants::NoProperty)"
                           ,
                           "pnode->AsParseNodeName()->pid->GetPropertyId() != Js::Constants::NoProperty"
                          );
        if (!bVar4) goto LAB_0077e4fb;
        *puVar18 = 0;
      }
      bVar4 = ByteCodeGenerator::IsThis(pnode);
      if (((bVar4) &&
          (pFVar12 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator),
          pFVar12->thisSymbol == (Symbol *)0x0)) && ((byteCodeGenerator->flags & 0x400) == 0)) {
        ByteCodeGenerator::AssignNullConstRegister(byteCodeGenerator);
        ByteCodeGenerator::AssignThisConstRegister(byteCodeGenerator);
      }
    }
    else if (((pSVar16->field_0x42 & 8) == 0) && (pSVar16->symbolType != STMemberName)) {
      pFVar12 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
      pFVar8 = Scope::GetEnclosingFunc(pSVar16->scope);
      if (pFVar12 == pFVar8) {
        pFVar12 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
        bVar4 = Symbol::IsInSlot(pSVar16,byteCodeGenerator,pFVar12,false);
        if ((!bVar4) && ((pSVar16->field_0x43 & 0x10) == 0)) {
          pFVar12 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
          uVar6 = Js::FunctionProxy::GetSourceContextId
                            (&pFVar12->byteCodeFunction->super_FunctionProxy);
          pFVar12 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
          LVar7 = Js::FunctionProxy::GetLocalFunctionId
                            (&pFVar12->byteCodeFunction->super_FunctionProxy);
          bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,DelayCapturePhase,uVar6,LVar7);
          if (bVar4) {
            pFVar12 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
            bVar4 = Symbol::NeedsSlotAlloc(pSVar16,byteCodeGenerator,pFVar12);
            if (bVar4) {
              Output::Print(L"--- DelayCapture: Delayed capturing symbol \'%s\'.\n",
                            (pSVar16->name).string.ptr);
              Output::Flush();
            }
          }
          ByteCodeGenerator::AssignRegister(byteCodeGenerator,pSVar16);
          bVar4 = ByteCodeGenerator::HasInterleavingDynamicScope(byteCodeGenerator,pSVar16);
          if (!bVar4) {
            pnode->location = pSVar16->location;
          }
        }
      }
    }
    if ((pnode->field_0x1 & 6) != 2) {
      return;
    }
    goto LAB_0077e16e;
  case knopInt:
    pPVar22 = ParseNode::AsParseNodeInt(pnode);
    RVar5 = ByteCodeGenerator::EnregisterConstant(byteCodeGenerator,pPVar22->lw);
    break;
  case knopBigInt:
    RVar5 = ByteCodeGenerator::EnregisterBigIntConstant(byteCodeGenerator,pnode);
    break;
  default:
    uVar6 = ParseNode::Grfnop((uint)pnode->nop);
    if ((uVar6 & 4) != 0) goto switchD_0077d7bc_caseD_6d;
    if ((uVar6 & 8) == 0) {
      return;
    }
    pPVar28 = ParseNode::AsParseNodeBin(pnode);
    CheckMaybeEscapedUse(pPVar28->pnode1,byteCodeGenerator,false);
  case knopMember:
  case knopMemberShort:
  case knopSetMember:
  case knopGetMember:
switchD_0077d7bc_caseD_4c:
    pPVar29 = (ParseNodeCall *)ParseNode::AsParseNodeBin(pnode);
LAB_0077e16a:
    pnode = pPVar29->pnodeArgs;
    goto LAB_0077e16e;
  case knopFlt:
    pPVar25 = ParseNode::AsParseNodeFloat(pnode);
    RVar5 = ByteCodeGenerator::EnregisterDoubleConstant(byteCodeGenerator,pPVar25->dbl);
    break;
  case knopStr:
    pPVar24 = ParseNode::AsParseNodeStr(pnode);
    RVar5 = ByteCodeGenerator::EnregisterStringConstant(byteCodeGenerator,pPVar24->pid);
    break;
  case knopNull:
    RVar5 = ByteCodeGenerator::AssignNullConstRegister(byteCodeGenerator);
    break;
  case knopFalse:
    RVar5 = ByteCodeGenerator::AssignFalseConstRegister(byteCodeGenerator);
    break;
  case knopTrue:
    RVar5 = ByteCodeGenerator::AssignTrueConstRegister(byteCodeGenerator);
    break;
  case knopYieldLeaf:
    ByteCodeGenerator::AssignFalseConstRegister(byteCodeGenerator);
    ByteCodeGenerator::AssignUndefinedConstRegister(byteCodeGenerator);
    AssignYieldResumeRegisters(byteCodeGenerator);
    return;
  case knopEllipsis:
    if (byteCodeGenerator->inDestructuredPattern == true) {
      RVar5 = ByteCodeGenerator::NextVarRegister(byteCodeGenerator);
      pnode->location = RVar5;
      uVar31 = 0;
      goto LAB_0077d7c4;
    }
  case knopThrow:
switchD_0077d7bc_caseD_6d:
    pPVar19 = (ParseNodeParamPattern *)ParseNode::AsParseNodeUni(pnode);
LAB_0077dd71:
    pnode = (pPVar19->super_ParseNodeUni).pnode1;
LAB_0077e16e:
    CheckMaybeEscapedUse(pnode,byteCodeGenerator,false);
    return;
  case knopIncPost:
  case knopDecPost:
  case knopIncPre:
  case knopDecPre:
    uVar31 = 1;
LAB_0077d7c4:
    ByteCodeGenerator::EnregisterConstant(byteCodeGenerator,uVar31);
    goto switchD_0077d7bc_caseD_6d;
  case knopObject:
  case knopCoalesce:
    ByteCodeGenerator::AssignNullConstRegister(byteCodeGenerator);
    return;
  case knopYield:
    goto switchD_0077d7bc_caseD_1d;
  case knopYieldStar:
    RVar5 = ByteCodeGenerator::NextVarRegister(byteCodeGenerator);
    pnode->location = RVar5;
    ByteCodeGenerator::AssignUndefinedConstRegister(byteCodeGenerator);
    ByteCodeGenerator::AssignTrueConstRegister(byteCodeGenerator);
switchD_0077d7bc_caseD_1d:
    ByteCodeGenerator::AssignFalseConstRegister(byteCodeGenerator);
    AssignYieldResumeRegisters(byteCodeGenerator);
    goto switchD_0077d7bc_caseD_6d;
  case knopAwait:
    AssignAwaitRegisters(byteCodeGenerator);
    goto switchD_0077d7bc_caseD_6d;
  case knopCall:
    pPVar29 = ParseNode::AsParseNodeCall(pnode);
    if ((pPVar29->pnodeTarget->nop != knopIndex) &&
       (pPVar29 = ParseNode::AsParseNodeCall(pnode), pPVar29->pnodeTarget->nop != knopDot)) {
      ByteCodeGenerator::AssignUndefinedConstRegister(byteCodeGenerator);
    }
    pFVar12 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
    pPVar29 = ParseNode::AsParseNodeCall(pnode);
    if ((pPVar29->field_0x24 & 4) == 0) {
      return;
    }
    pFVar21 = FuncInfo::GetParsedFunctionBody(pFVar12);
    if (((pFVar21->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47 & 0x10) != 0) {
      pFVar21 = FuncInfo::GetParsedFunctionBody(pFVar12);
      uVar31 = *(uint *)&pFVar21->field_0x178;
      pPVar29 = ParseNode::AsParseNodeCall(pnode);
      pPVar29->field_0x24 = pPVar29->field_0x24 & 0xfb | (byte)(uVar31 >> 0x16) & 4;
      return;
    }
    bVar4 = FuncInfo::IsGlobalFunction(pFVar12);
    if ((!bVar4) && ((pFVar12->field_0xb4 & 2) == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar18 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar18 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x1383,"(funcInfo->IsGlobalFunction() || funcInfo->GetCallsEval())",
                         "funcInfo->IsGlobalFunction() || funcInfo->GetCallsEval()");
      if (!bVar4) goto LAB_0077e4fb;
      *puVar18 = 0;
    }
    pFVar12->field_0xb4 = pFVar12->field_0xb4 | 2;
    pFVar21 = FuncInfo::GetParsedFunctionBody(pFVar12);
    pFVar21->field_0x17b = pFVar21->field_0x17b | 1;
    return;
  case knopDot:
    pPVar19 = (ParseNodeParamPattern *)ParseNode::AsParseNodeBin(pnode);
    goto LAB_0077dd71;
  case knopAsg:
    pPVar28 = ParseNode::AsParseNodeBin(pnode);
    if (pPVar28->pnode1->nop == knopName) {
      pPVar28 = ParseNode::AsParseNodeBin(pnode);
      pPVar26 = ParseNode::AsParseNodeName(pPVar28->pnode1);
      pSVar16 = pPVar26->sym;
    }
    else {
      pSVar16 = (Symbol *)0x0;
    }
    pPVar28 = ParseNode::AsParseNodeBin(pnode);
    CheckFuncAssignment(pSVar16,pPVar28->pnode2,byteCodeGenerator);
    if ((pnode->field_0x1 & 2) != 0) {
      pPVar28 = ParseNode::AsParseNodeBin(pnode);
      CheckMaybeEscapedUse(pPVar28->pnode1,byteCodeGenerator,false);
    }
    pPVar28 = ParseNode::AsParseNodeBin(pnode);
    if ((pPVar28->pnode1->nop != knopArrayPattern) &&
       (pPVar28 = ParseNode::AsParseNodeBin(pnode), pPVar28->pnode1->nop != knopObjectPattern)) {
      return;
    }
    ByteCodeGenerator::AssignUndefinedConstRegister(byteCodeGenerator);
    ByteCodeGenerator::EnregisterConstant(byteCodeGenerator,0);
    return;
  case knopComma:
    if ((pnode->field_0x1 & 4) != 0) {
      return;
    }
    goto switchD_0077d7bc_caseD_4c;
  case knopNew:
    pPVar29 = ParseNode::AsParseNodeCall(pnode);
    CheckMaybeEscapedUse(pPVar29->pnodeTarget,byteCodeGenerator,false);
    pPVar29 = ParseNode::AsParseNodeCall(pnode);
    goto LAB_0077e16a;
  case knopQmark:
    pPVar20 = ParseNode::AsParseNodeTri(pnode);
    CheckMaybeEscapedUse(pPVar20->pnode1,byteCodeGenerator,false);
    pPVar20 = ParseNode::AsParseNodeTri(pnode);
    CheckMaybeEscapedUse(pPVar20->pnode2,byteCodeGenerator,false);
    pPVar13 = (ParseNodeForInOrForOf *)ParseNode::AsParseNodeTri(pnode);
    goto LAB_0077e0ae;
  case knopVarDecl:
  case knopConstDecl:
  case knopLetDecl:
    pPVar15 = ParseNode::AsParseNodeVar(pnode);
    pSVar16 = pPVar15->sym;
    if (pSVar16 == (Symbol *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar18 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar18 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x13aa,"(sym != nullptr)","sym != nullptr");
      if (!bVar4) goto LAB_0077e4fb;
      *puVar18 = 0;
    }
    pFVar12 = Scope::GetEnclosingFunc(pSVar16->scope);
    pFVar8 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
    if (pFVar12 != pFVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar18 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar18 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x13ac,
                         "(sym->GetScope()->GetEnclosingFunc() == byteCodeGenerator->TopFuncInfo())"
                         ,"sym->GetScope()->GetEnclosingFunc() == byteCodeGenerator->TopFuncInfo()")
      ;
      if (!bVar4) goto LAB_0077e4fb;
      *puVar18 = 0;
    }
    pPVar15 = ParseNode::AsParseNodeVar(pnode);
    uVar2 = *(ushort *)&pSVar16->field_0x42;
    if ((pPVar15->isBlockScopeFncDeclVar != '\0') && ((uVar2 & 2) != 0)) {
      return;
    }
    pFVar12 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
    if ((uVar2 & 8) == 0) {
      pPVar15 = ParseNode::AsParseNodeVar(pnode);
      CheckFuncAssignment(pSVar16,pPVar15->pnodeInit,byteCodeGenerator);
      if ((((pSVar16->field_0x42 & 0x40) != 0) &&
          (pPVar15 = ParseNode::AsParseNodeVar(pnode),
          pPVar15->sym->scope->scopeType != ScopeType_CatchParamPattern)) ||
         ((pnode->nop == knopVarDecl &&
          (((pSVar16->field_0x42 & 2) != 0 &&
           (pPVar15 = ParseNode::AsParseNodeVar(pnode), pPVar15->isBlockScopeFncDeclVar == '\0')))))
         ) {
        if (((pSVar16->field_0x42 & 0x40) == 0) && (pFVar12->bodyScope == pSVar16->scope)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar18 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar18 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                             ,0x13c5,"(funcInfo->bodyScope != sym->GetScope())",
                             "funcInfo->bodyScope != sym->GetScope()");
          if (!bVar4) goto LAB_0077e4fb;
          *puVar18 = 0;
        }
        JsUtil::CharacterBuffer<char16_t>::CharacterBuffer
                  ((CharacterBuffer<char16_t> *)local_40,&pSVar16->name);
        pSVar16 = Scope::FindLocalSymbol(pFVar12->bodyScope,(CharacterBuffer<char16_t> *)local_40);
        if ((pSVar16 == (Symbol *)0x0) &&
           (pSVar16 = Scope::FindLocalSymbol(pFVar12->paramScope,(SymbolName *)local_40),
           pSVar16 == (Symbol *)0x0)) {
          pSVar16 = (Symbol *)0x0;
        }
        else if ((pSVar16->field_0x42 & 0x42) == 0) goto LAB_0077e45e;
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar18 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar18 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0x13cf,"((sym && !sym->GetIsCatch() && !sym->GetIsBlockVar()))",
                           "(sym && !sym->GetIsCatch() && !sym->GetIsBlockVar())");
        if (!bVar4) goto LAB_0077e4fb;
        *puVar18 = 0;
      }
LAB_0077e45e:
      if ((pSVar16->field_0x42 & 8) != 0) {
        return;
      }
      bVar4 = Symbol::IsInSlot(pSVar16,byteCodeGenerator,pFVar12,false);
      if (bVar4) {
        return;
      }
      uVar6 = Js::FunctionProxy::GetSourceContextId(&pFVar12->byteCodeFunction->super_FunctionProxy)
      ;
      LVar7 = Js::FunctionProxy::GetLocalFunctionId(&pFVar12->byteCodeFunction->super_FunctionProxy)
      ;
      bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,DelayCapturePhase,uVar6,LVar7);
      if (bVar4) {
        pFVar12 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
        bVar4 = Symbol::NeedsSlotAlloc(pSVar16,byteCodeGenerator,pFVar12);
        if (bVar4) {
          Output::Print(L"--- DelayCapture: Delayed capturing symbol \'%s\' during initialization.\n"
                        ,(pSVar16->name).string.ptr);
          Output::Flush();
        }
      }
      ByteCodeGenerator::AssignRegister(byteCodeGenerator,pSVar16);
      return;
    }
    bVar4 = FuncInfo::IsGlobalFunction(pFVar12);
    if (bVar4) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar18 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar18 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x13e3,"(byteCodeGenerator->TopFuncInfo()->IsGlobalFunction())",
                       "byteCodeGenerator->TopFuncInfo()->IsGlobalFunction()");
    if (bVar4) {
      *puVar18 = 0;
      return;
    }
LAB_0077e4fb:
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  case knopFncDecl:
    pFVar12 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
    bVar4 = FuncInfo::IsGlobalFunction(pFVar12);
    if (bVar4) {
      return;
    }
    pPVar27 = ParseNode::AsParseNodeFnc(pnode);
    if ((pPVar27->fncFlags & (kFunctionIsAsync|kFunctionIsGenerator)) != kFunctionNone) {
      pFVar12 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
      FuncInfo::SetHasMaybeEscapedNestedFunc(pFVar12,L"Generator");
    }
    if ((pnode->field_0x1 & 6) == 2) {
      pFVar12 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
      FuncInfo::SetHasMaybeEscapedNestedFunc(pFVar12,L"InList");
    }
    pPVar27 = ParseNode::AsParseNodeFnc(pnode);
    pPVar15 = pPVar27->pnodeName;
    if (pPVar15 == (ParseNodeVar *)0x0) {
      return;
    }
    if (((pPVar15->super_ParseNode).nop == knopVarDecl) &&
       (pPVar14 = ParseNode::AsParseNodeVar(&pPVar15->super_ParseNode),
       pPVar14->sym != (Symbol *)0x0)) {
      pPVar14 = ParseNode::AsParseNodeVar(&pPVar15->super_ParseNode);
      Symbol::SetHasFuncAssignment(pPVar14->sym,byteCodeGenerator);
      pPVar15 = ParseNode::AsParseNodeVar(&pPVar15->super_ParseNode);
      pSVar16 = Symbol::GetFuncScopeVarSym(pPVar15->sym);
      if (pSVar16 == (Symbol *)0x0) {
        return;
      }
      Symbol::SetHasFuncAssignment(pSVar16,byteCodeGenerator);
      return;
    }
    pFVar12 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
    OVar1 = (pPVar15->super_ParseNode).nop;
    if (OVar1 == knopDot) {
      reason = L"PropFuncName";
    }
    else if (OVar1 == knopList) {
      reason = L"MultipleFuncName";
    }
    else if (OVar1 == knopVarDecl) {
      pPVar15 = ParseNode::AsParseNodeVar(&pPVar15->super_ParseNode);
      reason = L"WeirdFuncName";
      if (pPVar15->sym == (Symbol *)0x0) {
        reason = L"WithScopeFuncName";
      }
    }
    else {
      reason = L"WeirdFuncName";
    }
    FuncInfo::SetHasMaybeEscapedNestedFunc(pFVar12,reason);
    return;
  case knopClassDecl:
    pFVar12 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
    FuncInfo::SetHasMaybeEscapedNestedFunc(pFVar12,L"Class");
    ByteCodeGenerator::AssignUndefinedConstRegister(byteCodeGenerator);
    return;
  case knopProg:
    if (byteCodeGenerator->parentScopeInfo != (ScopeInfo *)0x0) {
      return;
    }
    pPVar27 = ParseNode::AsParseNodeFnc(pnode);
    PostVisitFunction(pPVar27,byteCodeGenerator);
    return;
  case knopFor:
    pPVar10 = ParseNode::AsParseNodeFor(pnode);
    if ((pPVar10->pnodeBody != (ParseNodePtr)0x0) &&
       (pPVar10 = ParseNode::AsParseNodeFor(pnode), pPVar10->pnodeBody->nop == knopBlock)) {
      pPVar10 = ParseNode::AsParseNodeFor(pnode);
      pPVar11 = ParseNode::AsParseNodeBlock(pPVar10->pnodeBody);
      if (pPVar11->pnodeStmt != (ParseNodePtr)0x0) {
        pPVar10 = ParseNode::AsParseNodeFor(pnode);
        pPVar11 = ParseNode::AsParseNodeBlock(pPVar10->pnodeBody);
        if ((pPVar11->pnodeStmt->nop == knopFor) &&
           (bVar4 = ByteCodeGenerator::IsInDebugMode(byteCodeGenerator), !bVar4)) {
          pFVar12 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
          pPVar10 = InvertLoop(pnode,byteCodeGenerator,pFVar12);
          pPVar30 = ParseNode::AsParseNodeFor(pnode);
          pPVar30->pnodeInverted = pPVar10;
          return;
        }
      }
    }
    pPVar10 = ParseNode::AsParseNodeFor(pnode);
    pPVar10->pnodeInverted = (ParseNodeFor *)0x0;
    return;
  case knopForIn:
    pPVar13 = ParseNode::AsParseNodeForInOrForOf(pnode);
    goto LAB_0077e0ae;
  case knopForOf:
    goto switchD_0077d7bc_caseD_60;
  case knopForAwaitOf:
    AssignAwaitRegisters(byteCodeGenerator);
switchD_0077d7bc_caseD_60:
    pPVar13 = ParseNode::AsParseNodeForInOrForOf(pnode);
    ByteCodeGenerator::AssignNullConstRegister(byteCodeGenerator);
    ByteCodeGenerator::AssignUndefinedConstRegister(byteCodeGenerator);
    RVar5 = ByteCodeGenerator::NextVarRegister(byteCodeGenerator);
    pPVar13->shouldCallReturnFunctionLocation = RVar5;
    RVar5 = ByteCodeGenerator::NextVarRegister(byteCodeGenerator);
    pPVar13->shouldCallReturnFunctionLocationFinally = RVar5;
    pnode = pPVar13->pnodeObj;
    goto LAB_0077e16e;
  case knopStrTemplate:
    pPVar17 = ParseNode::AsParseNodeStrTemplate(pnode);
    pnode_00 = pPVar17->pnodeSubstitutionExpressions;
    if (pnode_00 != (ParseNodePtr)0x0) {
      puVar18 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      while (pnode_00->nop == knopList) {
        pPVar28 = ParseNode::AsParseNodeBin(pnode_00);
        if (pPVar28->pnode1 == (ParseNodePtr)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar18 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                             ,0x144b,"(pnodeExprs->AsParseNodeBin()->pnode1 != nullptr)",
                             "pnodeExprs->AsParseNodeBin()->pnode1 != nullptr");
          if (!bVar4) goto LAB_0077e4fb;
          *puVar18 = 0;
        }
        pPVar28 = ParseNode::AsParseNodeBin(pnode_00);
        if (pPVar28->pnode2 == (ParseNodePtr)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar18 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                             ,0x144c,"(pnodeExprs->AsParseNodeBin()->pnode2 != nullptr)",
                             "pnodeExprs->AsParseNodeBin()->pnode2 != nullptr");
          if (!bVar4) goto LAB_0077e4fb;
          *puVar18 = 0;
        }
        pPVar28 = ParseNode::AsParseNodeBin(pnode_00);
        CheckMaybeEscapedUse(pPVar28->pnode1,byteCodeGenerator,false);
        pPVar28 = ParseNode::AsParseNodeBin(pnode_00);
        pnode_00 = pPVar28->pnode2;
      }
      CheckMaybeEscapedUse(pnode_00,byteCodeGenerator,false);
    }
    pPVar17 = ParseNode::AsParseNodeStrTemplate(pnode);
    if ((pPVar17->field_0x2a & 1) == 0) {
      return;
    }
    RVar5 = ByteCodeGenerator::EnregisterStringTemplateCallsiteConstant(byteCodeGenerator,pnode);
    break;
  case knopWith:
    RVar5 = ByteCodeGenerator::NextVarRegister(byteCodeGenerator);
    pnode->location = RVar5;
    pPVar13 = (ParseNodeForInOrForOf *)ParseNode::AsParseNodeWith(pnode);
    goto LAB_0077e0ae;
  case knopSwitch:
    pPVar13 = (ParseNodeForInOrForOf *)ParseNode::AsParseNodeSwitch(pnode);
    goto LAB_0077e0ae;
  case knopCase:
    pPVar9 = ParseNode::AsParseNodeCase(pnode);
    pnode = pPVar9->pnodeExpr;
    goto LAB_0077e16e;
  case knopReturn:
    pFVar12 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
    bVar4 = FuncInfo::IsAsyncGenerator(pFVar12);
    if (bVar4) {
      AssignAwaitRegisters(byteCodeGenerator);
    }
    pPVar13 = (ParseNodeForInOrForOf *)ParseNode::AsParseNodeReturn(pnode);
LAB_0077e0ae:
    pnode = pPVar13->pnodeObj;
    goto LAB_0077e16e;
  case knopObjectPattern:
  case knopArrayPattern:
    ByteCodeGenerator::AssignUndefinedConstRegister(byteCodeGenerator);
    goto switchD_0077d7bc_caseD_6d;
  case knopParamPattern:
    ByteCodeGenerator::AssignUndefinedConstRegister(byteCodeGenerator);
    pPVar19 = ParseNode::AsParseNodeParamPattern(pnode);
    goto LAB_0077dd71;
  case knopExportDefault:
    pPVar23 = ParseNode::AsParseNodeExportDefault(pnode);
    pnode = pPVar23->pnodeExpr;
    if (pnode == (ParseNodePtr)0x0) {
      return;
    }
    goto LAB_0077e16e;
  }
  pnode->location = RVar5;
  return;
}

Assistant:

void AssignRegisters(ParseNode *pnode, ByteCodeGenerator *byteCodeGenerator)
{
    if (pnode == nullptr)
    {
        return;
    }

    Symbol *sym;
    OpCode nop = pnode->nop;
    switch (nop)
    {
    default:
        {
            uint flags = ParseNode::Grfnop(nop);
            if (flags & fnopUni)
            {
                CheckMaybeEscapedUse(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator);
            }
            else if (flags & fnopBin)
            {
                CheckMaybeEscapedUse(pnode->AsParseNodeBin()->pnode1, byteCodeGenerator);
                CheckMaybeEscapedUse(pnode->AsParseNodeBin()->pnode2, byteCodeGenerator);
            }
        break;
    }

    case knopParamPattern:
        byteCodeGenerator->AssignUndefinedConstRegister();
        CheckMaybeEscapedUse(pnode->AsParseNodeParamPattern()->pnode1, byteCodeGenerator);
        break;

    case knopObjectPattern:
    case knopArrayPattern:
        byteCodeGenerator->AssignUndefinedConstRegister();
        CheckMaybeEscapedUse(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator);
        break;

    case knopDot:
        CheckMaybeEscapedUse(pnode->AsParseNodeBin()->pnode1, byteCodeGenerator);
        break;
    case knopMember:
    case knopMemberShort:
    case knopGetMember:
    case knopSetMember:
        CheckMaybeEscapedUse(pnode->AsParseNodeBin()->pnode2, byteCodeGenerator);
        break;

    case knopAsg:
        {
            Symbol * symName = pnode->AsParseNodeBin()->pnode1->nop == knopName ? pnode->AsParseNodeBin()->pnode1->AsParseNodeName()->sym : nullptr;
            CheckFuncAssignment(symName, pnode->AsParseNodeBin()->pnode2, byteCodeGenerator);

            if (pnode->IsInList())
            {
                // Assignment in array literal
                CheckMaybeEscapedUse(pnode->AsParseNodeBin()->pnode1, byteCodeGenerator);
            }

            if ((pnode->AsParseNodeBin()->pnode1->nop == knopArrayPattern || pnode->AsParseNodeBin()->pnode1->nop == knopObjectPattern))
            {
                // Destructured arrays may have default values and need undefined.
                byteCodeGenerator->AssignUndefinedConstRegister();

                // Any rest parameter in a destructured array will need a 0 constant.
                byteCodeGenerator->EnregisterConstant(0);
            }

        break;
    }

    case knopEllipsis:
        if (byteCodeGenerator->InDestructuredPattern())
        {
            // Get a register for the rest array counter.
            pnode->location = byteCodeGenerator->NextVarRegister();

            // Any rest parameter in a destructured array will need a 0 constant.
            byteCodeGenerator->EnregisterConstant(0);
        }
        CheckMaybeEscapedUse(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator);
        break;

    case knopQmark:
        CheckMaybeEscapedUse(pnode->AsParseNodeTri()->pnode1, byteCodeGenerator);
        CheckMaybeEscapedUse(pnode->AsParseNodeTri()->pnode2, byteCodeGenerator);
        CheckMaybeEscapedUse(pnode->AsParseNodeTri()->pnode3, byteCodeGenerator);
        break;
    case knopWith:
        pnode->location = byteCodeGenerator->NextVarRegister();
        CheckMaybeEscapedUse(pnode->AsParseNodeWith()->pnodeObj, byteCodeGenerator);
        break;
    case knopComma:
        if (!pnode->IsNotEscapedUse())
        {
            // Only the last expr in comma expr escape. Mark it if it is escapable.
            CheckMaybeEscapedUse(pnode->AsParseNodeBin()->pnode2, byteCodeGenerator);
        }
        break;
    case knopFncDecl:
        if (!byteCodeGenerator->TopFuncInfo()->IsGlobalFunction())
        {
            if (pnode->AsParseNodeFnc()->IsCoroutine())
            {
                // Assume generators always escape; otherwise need to analyze if
                // the return value of calls to generator function, the generator
                // objects, escape.
                FuncInfo* funcInfo = byteCodeGenerator->TopFuncInfo();
                funcInfo->SetHasMaybeEscapedNestedFunc(DebugOnly(_u("Generator")));
            }

            if (pnode->IsInList() && !pnode->IsNotEscapedUse())
            {
                byteCodeGenerator->TopFuncInfo()->SetHasMaybeEscapedNestedFunc(DebugOnly(_u("InList")));
            }

            ParseNodePtr pnodeName = pnode->AsParseNodeFnc()->pnodeName;
            if (pnodeName != nullptr)
            {
                // REVIEW: does this apply now that compat mode is gone?
                // There is a weird case in compat mode where we may not have a sym assigned to a fnc decl's
                // name node if it is a named function declare inside 'with' that also assigned to something else
                // as well. Instead, We generate two knopFncDecl node one for parent function and one for the assignment.
                // Only the top one gets a sym, not the inner one.  The assignment in the 'with' will be using the inner
                // one.  Also we will detect that the assignment to a variable is an escape inside a 'with'.
                // Since we need the sym in the fnc decl's name, we just detect the escape here as "WithScopeFuncName".

                if (pnodeName->nop == knopVarDecl && pnodeName->AsParseNodeVar()->sym != nullptr)
                {
                    // Unlike in CheckFuncAssignment, we don't check for interleaving
                    // dynamic scope ('with') here, because we also generate direct assignment for
                    // function decl's names

                    pnodeName->AsParseNodeVar()->sym->SetHasFuncAssignment(byteCodeGenerator);

                    // Function declaration in block scope and non-strict mode has a
                    // corresponding var sym that we assign to as well.  Need to
                    // mark that symbol as has func assignment as well.
                    Symbol * functionScopeVarSym = pnodeName->AsParseNodeVar()->sym->GetFuncScopeVarSym();
                    if (functionScopeVarSym)
                    {
                        functionScopeVarSym->SetHasFuncAssignment(byteCodeGenerator);
                    }
                }
                else
                {
                    // The function has multiple names, or assign to o.x or o::x
                    byteCodeGenerator->TopFuncInfo()->SetHasMaybeEscapedNestedFunc(DebugOnly(
                        pnodeName->nop == knopList ? _u("MultipleFuncName") :
                        pnodeName->nop == knopDot ? _u("PropFuncName") :
                        pnodeName->nop == knopVarDecl && pnodeName->AsParseNodeVar()->sym == nullptr ? _u("WithScopeFuncName") :
                        _u("WeirdFuncName")
                    ));
                }
            }
        }

        break;
    case knopNew:
        CheckMaybeEscapedUse(pnode->AsParseNodeCall()->pnodeTarget, byteCodeGenerator);
        CheckMaybeEscapedUse(pnode->AsParseNodeCall()->pnodeArgs, byteCodeGenerator);
        break;
    case knopThrow:
        CheckMaybeEscapedUse(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator);
        break;

    // REVIEW: Technically, switch expr or case expr doesn't really escape as strict equal
    // doesn't cause the function to escape.
    case knopSwitch:
        CheckMaybeEscapedUse(pnode->AsParseNodeSwitch()->pnodeVal, byteCodeGenerator);
        break;
    case knopCase:
        CheckMaybeEscapedUse(pnode->AsParseNodeCase()->pnodeExpr, byteCodeGenerator);
        break;

    // REVIEW: Technically, the object for GetForInEnumerator doesn't escape, except when cached,
    // which we can make work.
    case knopForIn:
        CheckMaybeEscapedUse(pnode->AsParseNodeForInOrForOf()->pnodeObj, byteCodeGenerator);
        break;

    case knopForAwaitOf:
        AssignAwaitRegisters(byteCodeGenerator);
        // Fall-through
    case knopForOf:
        {
            ParseNodeForInOrForOf* pnodeForOf = pnode->AsParseNodeForInOrForOf();
            byteCodeGenerator->AssignNullConstRegister();
            byteCodeGenerator->AssignUndefinedConstRegister();
            pnodeForOf->shouldCallReturnFunctionLocation = byteCodeGenerator->NextVarRegister();
            pnodeForOf->shouldCallReturnFunctionLocationFinally = byteCodeGenerator->NextVarRegister();
            CheckMaybeEscapedUse(pnodeForOf->pnodeObj, byteCodeGenerator);
        }
        break;

    case knopTrue:
        pnode->location = byteCodeGenerator->AssignTrueConstRegister();
        break;

    case knopFalse:
        pnode->location = byteCodeGenerator->AssignFalseConstRegister();
        break;

    case knopDecPost:
    case knopIncPost:
    case knopDecPre:
    case knopIncPre:
        byteCodeGenerator->EnregisterConstant(1);
        CheckMaybeEscapedUse(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator);
        break;
    case knopCoalesce:
    case knopObject:
        byteCodeGenerator->AssignNullConstRegister();
        break;
    case knopClassDecl:
        {
            FuncInfo * topFunc = byteCodeGenerator->TopFuncInfo();
            topFunc->SetHasMaybeEscapedNestedFunc(DebugOnly(_u("Class")));

            // We may need undefined for the 'this', e.g. calling a class expression
            byteCodeGenerator->AssignUndefinedConstRegister();

        break;
        }
    case knopNull:
        pnode->location = byteCodeGenerator->AssignNullConstRegister();
        break;
    case knopCall:
    {
        if (pnode->AsParseNodeCall()->pnodeTarget->nop != knopIndex &&
            pnode->AsParseNodeCall()->pnodeTarget->nop != knopDot)
        {
            byteCodeGenerator->AssignUndefinedConstRegister();
        }

        FuncInfo *funcInfo = byteCodeGenerator->TopFuncInfo();

        if (pnode->AsParseNodeCall()->isEvalCall)
        {
            if (!funcInfo->GetParsedFunctionBody()->IsReparsed())
            {
                Assert(funcInfo->IsGlobalFunction() || funcInfo->GetCallsEval());
                funcInfo->SetCallsEval(true);
                funcInfo->GetParsedFunctionBody()->SetCallsEval(true);
            }
            else
            {
                // On reparsing, load the state from function Body, instead of using the state on the parse node,
                // as they might be different.
                pnode->AsParseNodeCall()->isEvalCall = funcInfo->GetParsedFunctionBody()->GetCallsEval();
            }
        }
        // Don't need to check pnode->AsParseNodeCall()->pnodeTarget even if it is a knopFncDecl,
        // e.g. (function(){})();
        // It is only used as a call, so don't count as an escape.
        // Although not assigned to a slot, we will still able to box it by boxing
        // all the stack function on the interpreter frame or the stack function link list
        // on a jitted frame
        break;
    }

    case knopInt:
        pnode->location = byteCodeGenerator->EnregisterConstant(pnode->AsParseNodeInt()->lw);
        break;
    case knopFlt:
    {
        pnode->location = byteCodeGenerator->EnregisterDoubleConstant(pnode->AsParseNodeFloat()->dbl);
        break;
    }
    case knopBigInt:
        pnode->location = byteCodeGenerator->EnregisterBigIntConstant(pnode);
        break;
    case knopStr:
        pnode->location = byteCodeGenerator->EnregisterStringConstant(pnode->AsParseNodeStr()->pid);
        break;
    case knopVarDecl:
    case knopConstDecl:
    case knopLetDecl:
        {
            sym = pnode->AsParseNodeVar()->sym;
            Assert(sym != nullptr);

            Assert(sym->GetScope()->GetEnclosingFunc() == byteCodeGenerator->TopFuncInfo());

            if (pnode->AsParseNodeVar()->isBlockScopeFncDeclVar && sym->GetIsBlockVar())
            {
                break;
            }

            if (!sym->GetIsGlobal())
            {
                FuncInfo *funcInfo = byteCodeGenerator->TopFuncInfo();

                // Check the function assignment for the sym that we have, even if we remap it to function level sym below
                // as we are going assign to the original sym
                CheckFuncAssignment(sym, pnode->AsParseNodeVar()->pnodeInit, byteCodeGenerator);

                // If this is a destructured param case then it is a let binding and we don't have to look for duplicate symbol in the body
                if ((sym->GetIsCatch() && pnode->AsParseNodeVar()->sym->GetScope()->GetScopeType() != ScopeType_CatchParamPattern) || (pnode->nop == knopVarDecl && sym->GetIsBlockVar() && !pnode->AsParseNodeVar()->isBlockScopeFncDeclVar))
                {
                    // The LHS of the var decl really binds to the local symbol, not the catch or let symbol.
                    // But the assignment will go to the catch or let symbol. Just assign a register to the local
                    // so that it can get initialized to undefined.
#if DBG
                    if (!sym->GetIsCatch())
                    {
                        // Catch cannot be at function scope and let and var at function scope is redeclaration error.
                        Assert(funcInfo->bodyScope != sym->GetScope());
                    }
#endif
                    auto symName = sym->GetName();
                    sym = funcInfo->bodyScope->FindLocalSymbol(symName);

                    if (sym == nullptr)
                    {
                        sym = funcInfo->paramScope->FindLocalSymbol(symName);
                    }
                    Assert((sym && !sym->GetIsCatch() && !sym->GetIsBlockVar()));
                }
                // Don't give the declared var a register if it's in a closure, because the closure slot
                // is its true "home". (Need to check IsGlobal again as the sym may have changed above.)
                if (!sym->GetIsGlobal() && !sym->IsInSlot(byteCodeGenerator, funcInfo))
                {
                    if (PHASE_TRACE(Js::DelayCapturePhase, funcInfo->byteCodeFunction))
                    {
                        if (sym->NeedsSlotAlloc(byteCodeGenerator, byteCodeGenerator->TopFuncInfo()))
                        {
                            Output::Print(_u("--- DelayCapture: Delayed capturing symbol '%s' during initialization.\n"),
                                sym->GetName().GetBuffer());
                            Output::Flush();
                        }
                    }
                    byteCodeGenerator->AssignRegister(sym);
                }
            }
            else
            {
                Assert(byteCodeGenerator->TopFuncInfo()->IsGlobalFunction());
            }

            break;
        }

    case knopFor:
        if ((pnode->AsParseNodeFor()->pnodeBody != nullptr) && (pnode->AsParseNodeFor()->pnodeBody->nop == knopBlock) &&
            (pnode->AsParseNodeFor()->pnodeBody->AsParseNodeBlock()->pnodeStmt != nullptr) &&
            (pnode->AsParseNodeFor()->pnodeBody->AsParseNodeBlock()->pnodeStmt->nop == knopFor) &&
            (!byteCodeGenerator->IsInDebugMode()))
        {
                FuncInfo *funcInfo = byteCodeGenerator->TopFuncInfo();
            pnode->AsParseNodeFor()->pnodeInverted = InvertLoop(pnode, byteCodeGenerator, funcInfo);
        }
        else
        {
            pnode->AsParseNodeFor()->pnodeInverted = nullptr;
        }

        break;

    case knopName:
        sym = pnode->AsParseNodeName()->sym;
        if (sym == nullptr)
        {
            Assert(pnode->AsParseNodeName()->pid->GetPropertyId() != Js::Constants::NoProperty);

            // Referring to 'this' with no var decl needs to load 'this' root value via LdThis from null
            if (ByteCodeGenerator::IsThis(pnode) && !byteCodeGenerator->TopFuncInfo()->GetThisSymbol() && !(byteCodeGenerator->GetFlags() & fscrEval))
            {
                byteCodeGenerator->AssignNullConstRegister();
                byteCodeGenerator->AssignThisConstRegister();
            }
        }
        else
        {
            // Note: don't give a register to a local if it's in a closure, because then the closure
            // is its true home.
            if (!sym->GetIsGlobal() &&
                !sym->GetIsMember() &&
                byteCodeGenerator->TopFuncInfo() == sym->GetScope()->GetEnclosingFunc() &&
                !sym->IsInSlot(byteCodeGenerator, byteCodeGenerator->TopFuncInfo()) &&
                !sym->HasVisitedCapturingFunc())
            {
                if (PHASE_TRACE(Js::DelayCapturePhase, byteCodeGenerator->TopFuncInfo()->byteCodeFunction))
                {
                    if (sym->NeedsSlotAlloc(byteCodeGenerator, byteCodeGenerator->TopFuncInfo()))
                    {
                        Output::Print(_u("--- DelayCapture: Delayed capturing symbol '%s'.\n"),
                            sym->GetName().GetBuffer());
                        Output::Flush();
                    }
                }

                // Local symbol being accessed in its own frame. Even if "with" or event
                // handler semantics make the binding ambiguous, it has a home location,
                // so assign it.
                byteCodeGenerator->AssignRegister(sym);

                // If we're in something like a "with" we'll need a scratch register to hold
                // the multiple possible values of the property.
                if (!byteCodeGenerator->HasInterleavingDynamicScope(sym))
                {
                    // We're not in a dynamic scope, or our home scope is nested within the dynamic scope, so we
                    // don't have to do dynamic binding. Just use the home location for this reference.
                    pnode->location = sym->GetLocation();
                }
            }
        }
        if (pnode->IsInList() && !pnode->IsNotEscapedUse())
        {
            // A node that is in a list is assumed to be escape, unless marked otherwise.
            // This includes array literal list/object literal list
            CheckMaybeEscapedUse(pnode, byteCodeGenerator);
        }
        break;

    case knopProg:
        if (!byteCodeGenerator->HasParentScopeInfo())
        {
            // If we're compiling a nested deferred function, don't pop the scope stack,
            // because we just want to leave it as-is for the emit pass.
            PostVisitFunction(pnode->AsParseNodeFnc(), byteCodeGenerator);
        }
        break;
    case knopReturn:
        {
            if (byteCodeGenerator->TopFuncInfo()->IsAsyncGenerator())
            {
                AssignAwaitRegisters(byteCodeGenerator);
            }
            ParseNode *pnodeExpr = pnode->AsParseNodeReturn()->pnodeExpr;
            CheckMaybeEscapedUse(pnodeExpr, byteCodeGenerator);
            break;
        }

    case knopStrTemplate:
        {
            ParseNode* pnodeExprs = pnode->AsParseNodeStrTemplate()->pnodeSubstitutionExpressions;
            if (pnodeExprs != nullptr)
            {
                while (pnodeExprs->nop == knopList)
                {
                    Assert(pnodeExprs->AsParseNodeBin()->pnode1 != nullptr);
                    Assert(pnodeExprs->AsParseNodeBin()->pnode2 != nullptr);

                    CheckMaybeEscapedUse(pnodeExprs->AsParseNodeBin()->pnode1, byteCodeGenerator);
                    pnodeExprs = pnodeExprs->AsParseNodeBin()->pnode2;
                }

                // Also check the final element in the list
                CheckMaybeEscapedUse(pnodeExprs, byteCodeGenerator);
            }

            if (pnode->AsParseNodeStrTemplate()->isTaggedTemplate)
            {
                pnode->location = byteCodeGenerator->EnregisterStringTemplateCallsiteConstant(pnode);
            }
            break;
        }
    case knopExportDefault:
        {
            ParseNode* expr = pnode->AsParseNodeExportDefault()->pnodeExpr;

            if (expr != nullptr)
            {
                CheckMaybeEscapedUse(expr, byteCodeGenerator);
            }

            break;
        }
    case knopYieldLeaf:
        // The done property of the result object is set to false and the
        // value property is set to undefined
        byteCodeGenerator->AssignFalseConstRegister();
        byteCodeGenerator->AssignUndefinedConstRegister();
        AssignYieldResumeRegisters(byteCodeGenerator);
        break;
    case knopAwait:
        AssignAwaitRegisters(byteCodeGenerator);
        CheckMaybeEscapedUse(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator);
        break;
    case knopYield:
        // The done property of the result object is set to false
        byteCodeGenerator->AssignFalseConstRegister();
        AssignYieldResumeRegisters(byteCodeGenerator);
        CheckMaybeEscapedUse(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator);
        break;
    case knopYieldStar:
        // Reserve a local for our YieldStar loop so that the backend doesn't complain
        pnode->location = byteCodeGenerator->NextVarRegister();
        byteCodeGenerator->AssignUndefinedConstRegister();
        byteCodeGenerator->AssignTrueConstRegister();
        byteCodeGenerator->AssignFalseConstRegister();
        AssignYieldResumeRegisters(byteCodeGenerator);
        CheckMaybeEscapedUse(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator);
        break;
    }
}